

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O0

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deInt32 value)

{
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  uint local_18;
  deUint8 data [4];
  deInt32 val;
  deInt32 value_local;
  SeedBuilder *builder_local;
  
  local_18 = value ^ 0x3298d15;
  local_1c = (undefined1)local_18;
  local_1b = (undefined1)(local_18 >> 8);
  local_1a = (undefined1)(local_18 >> 0x10);
  local_19 = (undefined1)(local_18 >> 0x18);
  data = (deUint8  [4])value;
  SeedBuilder::feed(builder,4,&local_1c);
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deInt32 value)
{
	const deInt32	val		= value ^ 53054741;
	const deUint8	data[]	=
	{
		(deUint8)(((deUint32)val) & 0xFFu),
		(deUint8)((((deUint32)val) >> 8) & 0xFFu),
		(deUint8)((((deUint32)val) >> 16) & 0xFFu),
		(deUint8)((((deUint32)val) >> 24) & 0xFFu),
	};

	builder.feed(sizeof(data), data);
	return builder;
}